

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void __thiscall booster::log::sinks::file::shift(file *this,string *base)

{
  char *__old;
  _Alloc_hider __old_00;
  int n;
  _Alloc_hider this_00;
  string local_70;
  string local_50;
  
  this_00._M_p = (pointer)base;
  format_file(&local_70,(file *)base,base,this->max_files_);
  remove(local_70._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  n = this->max_files_ - 1;
  if (n != 0) {
    do {
      format_file(&local_70,(file *)this_00._M_p,base,n);
      __old_00._M_p = local_70._M_dataplus._M_p;
      format_file(&local_50,(file *)this_00._M_p,base,n + 1);
      this_00._M_p = local_50._M_dataplus._M_p;
      rename(__old_00._M_p,local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      n = n + -1;
    } while (n != 0);
  }
  __old = (base->_M_dataplus)._M_p;
  format_file(&local_70,(file *)this_00._M_p,base,1);
  rename(__old,local_70._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void file::shift(std::string const &base)
		{
			booster::nowide::remove(format_file(base,max_files_).c_str());
			for(unsigned file = max_files_-1;file > 0 ; file --) {
				booster::nowide::rename(format_file(base,file).c_str(),format_file(base,file+1).c_str());
			}
			
			booster::nowide::rename(base.c_str(),format_file(base,1).c_str());
		}